

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeLinkInterfaceLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget,LinkInterfaceFor interfaceFor)

{
  cmLocalGenerator *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  TargetType TVar4;
  cmValue __rhs;
  cmValue __lhs;
  ostream *poVar5;
  string *psVar6;
  cmLinkImplementationLibraries *rng;
  PolicyID id;
  PolicyID id_00;
  cmBTStringRange cVar7;
  string_view separator;
  string_view separator_00;
  string linkIfacePropCMP0022OLD;
  string local_328;
  string oldLibraries;
  string suffix;
  string newLibraries;
  ostringstream w;
  cmLinkInterface ifaceNew;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&suffix,"_",(allocator<char> *)&w);
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&suffix);
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&w,config);
    std::__cxx11::string::append((string *)&suffix);
    std::__cxx11::string::~string((string *)&w);
  }
  linkIfacePropCMP0022OLD._M_dataplus._M_p = (pointer)&linkIfacePropCMP0022OLD.field_2;
  linkIfacePropCMP0022OLD._M_string_length = 0;
  linkIfacePropCMP0022OLD.field_2._M_local_buf[0] = '\0';
  PVar3 = GetPolicyStatusCMP0022(this);
  if (PVar3 == OLD) {
LAB_0038a892:
    TVar4 = GetType(this);
    if (TVar4 == SHARED_LIBRARY) {
LAB_0038a8af:
      _w = &DAT_00000018;
      ifaceNew.super_cmLinkInterfaceLibraries.Libraries.
      super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)suffix._M_string_length;
      ifaceNew.super_cmLinkInterfaceLibraries.Libraries.
      super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)suffix._M_dataplus._M_p;
      cmStrCat<>(&oldLibraries,(cmAlphaNum *)&w,(cmAlphaNum *)&ifaceNew);
      std::__cxx11::string::operator=((string *)&linkIfacePropCMP0022OLD,(string *)&oldLibraries);
      std::__cxx11::string::~string((string *)&oldLibraries);
      __rhs = GetProperty(this,&linkIfacePropCMP0022OLD);
      if (__rhs.Value == (string *)0x0) {
        std::__cxx11::string::assign((char *)&linkIfacePropCMP0022OLD);
        __rhs = GetProperty(this,&linkIfacePropCMP0022OLD);
        if (__rhs.Value == (string *)0x0) goto LAB_0038aede;
      }
      PVar3 = GetPolicyStatusCMP0022(this);
      if ((PVar3 == WARN) && (this->PolicyWarnedCMP0022 == false)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"INTERFACE_LINK_LIBRARIES",(allocator<char> *)&ifaceNew);
        __lhs = GetProperty(this,(string *)&w);
        std::__cxx11::string::~string((string *)&w);
        if (__lhs.Value != (string *)0x0) {
          bVar2 = std::operator!=(__lhs.Value,__rhs.Value);
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
            cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&ifaceNew,(cmPolicies *)0x16,id);
            poVar5 = std::operator<<((ostream *)&w,(string *)&ifaceNew);
            poVar5 = std::operator<<(poVar5,"\nTarget \"");
            psVar6 = GetName_abi_cxx11_(this);
            poVar5 = std::operator<<(poVar5,(string *)psVar6);
            poVar5 = std::operator<<(poVar5,
                                     "\" has an INTERFACE_LINK_LIBRARIES property which differs from its "
                                    );
            poVar5 = std::operator<<(poVar5,(string *)&linkIfacePropCMP0022OLD);
            poVar5 = std::operator<<(poVar5," properties.\nINTERFACE_LINK_LIBRARIES:\n  ");
            poVar5 = std::operator<<(poVar5,(string *)__lhs.Value);
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,(string *)&linkIfacePropCMP0022OLD);
            poVar5 = std::operator<<(poVar5,":\n  ");
            poVar5 = std::operator<<(poVar5,(string *)__rhs.Value);
            std::operator<<(poVar5,"\n");
            std::__cxx11::string::~string((string *)&ifaceNew);
            pcVar1 = this->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&ifaceNew);
            std::__cxx11::string::~string((string *)&ifaceNew);
            this->PolicyWarnedCMP0022 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
          }
        }
      }
      (iface->super_cmLinkInterface).field_0xf4 = 1;
    }
    else {
      bVar2 = IsExecutableWithExports(this);
      if (bVar2) goto LAB_0038a8af;
LAB_0038aede:
      bVar2 = false;
LAB_0038aee0:
      TVar4 = GetType(this);
      if (TVar4 == EXECUTABLE) goto LAB_0038aef9;
      TVar4 = GetType(this);
      if (TVar4 == MODULE_LIBRARY) goto LAB_0038aef9;
      (iface->super_cmLinkInterface).field_0xf4 = 1;
      if (bVar2) goto LAB_0038ab9e;
      __rhs.Value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    (iface->super_cmLinkInterface).field_0xf5 =
         __rhs.Value != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (__rhs.Value != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _w = (pointer)0x0;
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)&w,
                 __rhs.Value);
      cVar7.End._M_current =
           (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           0x0;
      cVar7.Begin._M_current =
           (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           _w;
      ExpandLinkItems(this,&linkIfacePropCMP0022OLD,cVar7,config,headTarget,interfaceFor,Libraries,
                      &iface->super_cmLinkInterface);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&w);
    }
  }
  else {
    PVar3 = GetPolicyStatusCMP0022(this);
    if (PVar3 == WARN) goto LAB_0038a892;
    cVar7 = cmTarget::GetLinkInterfaceEntries_abi_cxx11_(this->Target);
    if (cVar7.Begin._M_current._M_current == cVar7.End._M_current._M_current) {
      cVar7 = cmTarget::GetLinkInterfaceDirectEntries_abi_cxx11_(this->Target);
      if (cVar7.Begin._M_current._M_current != cVar7.End._M_current._M_current) goto LAB_0038ab96;
      cVar7 = cmTarget::GetLinkInterfaceDirectExcludeEntries_abi_cxx11_(this->Target);
      if (cVar7.Begin._M_current._M_current != cVar7.End._M_current._M_current) goto LAB_0038ab96;
      bVar2 = true;
      goto LAB_0038aee0;
    }
LAB_0038ab96:
    (iface->super_cmLinkInterface).field_0xf4 = 1;
LAB_0038ab9e:
    (iface->super_cmLinkInterface).field_0xf5 = 1;
    cVar7 = cmTarget::GetLinkInterfaceEntries_abi_cxx11_(this->Target);
    ExpandLinkItems(this,(string *)(anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_abi_cxx11_,cVar7
                    ,config,headTarget,interfaceFor,Libraries,&iface->super_cmLinkInterface);
    cVar7 = cmTarget::GetLinkInterfaceDirectEntries_abi_cxx11_(this->Target);
    ExpandLinkItems(this,(string *)
                         (anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_,cVar7,
                    config,headTarget,interfaceFor,HeadInclude,&iface->super_cmLinkInterface);
    cVar7 = cmTarget::GetLinkInterfaceDirectExcludeEntries_abi_cxx11_(this->Target);
    ExpandLinkItems(this,(string *)
                         (anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_,
                    cVar7,config,headTarget,interfaceFor,HeadExclude,&iface->super_cmLinkInterface);
  }
  if ((iface->super_cmLinkInterface).field_0xf5 == '\0') {
    rng = GetLinkImplementationLibrariesInternal(this,config,headTarget,interfaceFor);
    if (rng != (cmLinkImplementationLibraries *)0x0) {
      std::vector<cmLinkItem,std::allocator<cmLinkItem>>::
      insert<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>,void>
                ((vector<cmLinkItem,std::allocator<cmLinkItem>> *)iface,
                 (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (rng->Libraries).
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (rng->Libraries).
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      PVar3 = GetPolicyStatusCMP0022(this);
      if (((PVar3 == WARN) && (interfaceFor == Link)) && (this->PolicyWarnedCMP0022 == false)) {
        ifaceNew.LanguageRuntimeLibraries._M_h._M_buckets =
             &ifaceNew.LanguageRuntimeLibraries._M_h._M_single_bucket;
        ifaceNew.super_cmLinkInterfaceLibraries.HeadExclude.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        ifaceNew.super_cmLinkInterfaceLibraries.HeadExclude.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        ifaceNew.super_cmLinkInterfaceLibraries.HeadInclude.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        ifaceNew.super_cmLinkInterfaceLibraries.HeadExclude.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        ifaceNew.super_cmLinkInterfaceLibraries.HeadInclude.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        ifaceNew.super_cmLinkInterfaceLibraries.HeadInclude.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        ifaceNew.super_cmLinkInterfaceLibraries.Objects.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        ifaceNew.super_cmLinkInterfaceLibraries.Objects.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        ifaceNew.super_cmLinkInterfaceLibraries.Libraries.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        ifaceNew.super_cmLinkInterfaceLibraries.Objects.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        ifaceNew.super_cmLinkInterfaceLibraries.HadHeadSensitiveCondition = false;
        ifaceNew.super_cmLinkInterfaceLibraries.HadContextSensitiveCondition = false;
        ifaceNew.super_cmLinkInterfaceLibraries.Libraries.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        ifaceNew.super_cmLinkInterfaceLibraries.Libraries.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        ifaceNew.Languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ifaceNew.Languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ifaceNew.Languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ifaceNew.LanguageRuntimeLibraries._M_h._M_bucket_count = 1;
        ifaceNew.LanguageRuntimeLibraries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        ifaceNew.LanguageRuntimeLibraries._M_h._M_element_count = 0;
        ifaceNew.LanguageRuntimeLibraries._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        ifaceNew.LanguageRuntimeLibraries._M_h._M_rehash_policy._M_next_resize = 0;
        ifaceNew.LanguageRuntimeLibraries._M_h._M_single_bucket = (__node_base_ptr)0x0;
        ifaceNew.SharedDeps.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ifaceNew.SharedDeps.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        ifaceNew.SharedDeps.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        ifaceNew.SharedDeps.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        ifaceNew._204_8_ = 0;
        ifaceNew.WrongConfigLibraries.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ifaceNew.WrongConfigLibraries.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
        ifaceNew.WrongConfigLibraries.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
        _M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
        ifaceNew.WrongConfigLibraries.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
        ifaceNew._234_8_ = 0;
        cVar7 = cmTarget::GetLinkInterfaceEntries_abi_cxx11_(this->Target);
        ExpandLinkItems(this,(string *)(anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_abi_cxx11_,
                        cVar7,config,headTarget,Link,Libraries,&ifaceNew);
        bVar2 = std::operator!=((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)&ifaceNew,
                                (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
        if (bVar2) {
          separator._M_str = ";";
          separator._M_len = 1;
          cmJoin<std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
                    (&oldLibraries,&rng->Libraries,separator);
          separator_00._M_str = ";";
          separator_00._M_len = 1;
          cmJoin<std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
                    (&newLibraries,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)&ifaceNew,
                     separator_00);
          if (oldLibraries._M_string_length == 0) {
            std::__cxx11::string::assign((char *)&oldLibraries);
          }
          if (newLibraries._M_string_length == 0) {
            std::__cxx11::string::assign((char *)&newLibraries);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_328,(cmPolicies *)0x16,id_00);
          poVar5 = std::operator<<((ostream *)&w,(string *)&local_328);
          poVar5 = std::operator<<(poVar5,"\nTarget \"");
          psVar6 = GetName_abi_cxx11_(this);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          poVar5 = std::operator<<(poVar5,
                                   "\" has an INTERFACE_LINK_LIBRARIES property.  This should be preferred as the source of the link interface for this library but because CMP0022 is not set CMake is ignoring the property and using the link implementation as the link interface instead.\nINTERFACE_LINK_LIBRARIES:\n  "
                                  );
          poVar5 = std::operator<<(poVar5,(string *)&newLibraries);
          poVar5 = std::operator<<(poVar5,"\nLink implementation:\n  ");
          poVar5 = std::operator<<(poVar5,(string *)&oldLibraries);
          std::operator<<(poVar5,"\n");
          std::__cxx11::string::~string((string *)&local_328);
          pcVar1 = this->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(pcVar1,AUTHOR_WARNING,&local_328);
          std::__cxx11::string::~string((string *)&local_328);
          this->PolicyWarnedCMP0022 = true;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
          std::__cxx11::string::~string((string *)&newLibraries);
          std::__cxx11::string::~string((string *)&oldLibraries);
        }
        cmLinkInterface::~cmLinkInterface(&ifaceNew);
      }
    }
  }
LAB_0038aef9:
  std::__cxx11::string::~string((string *)&linkIfacePropCMP0022OLD);
  std::__cxx11::string::~string((string *)&suffix);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterfaceLibraries(
  const std::string& config, cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget, LinkInterfaceFor interfaceFor) const
{
  // Construct the property name suffix for this configuration.
  std::string suffix = "_";
  if (!config.empty()) {
    suffix += cmSystemTools::UpperCase(config);
  } else {
    suffix += "NOCONFIG";
  }

  // An explicit list of interface libraries may be set for shared
  // libraries and executables that export symbols.
  bool haveExplicitLibraries = false;
  cmValue explicitLibrariesCMP0022OLD;
  std::string linkIfacePropCMP0022OLD;
  bool const cmp0022NEW = (this->GetPolicyStatusCMP0022() != cmPolicies::OLD &&
                           this->GetPolicyStatusCMP0022() != cmPolicies::WARN);
  if (cmp0022NEW) {
    // CMP0022 NEW behavior is to use INTERFACE_LINK_LIBRARIES.
    haveExplicitLibraries = !this->Target->GetLinkInterfaceEntries().empty() ||
      !this->Target->GetLinkInterfaceDirectEntries().empty() ||
      !this->Target->GetLinkInterfaceDirectExcludeEntries().empty();
  } else {
    // CMP0022 OLD behavior is to use LINK_INTERFACE_LIBRARIES if set on a
    // shared lib or executable.
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->IsExecutableWithExports()) {
      // Lookup the per-configuration property.
      linkIfacePropCMP0022OLD = cmStrCat("LINK_INTERFACE_LIBRARIES", suffix);
      explicitLibrariesCMP0022OLD = this->GetProperty(linkIfacePropCMP0022OLD);

      // If not set, try the generic property.
      if (!explicitLibrariesCMP0022OLD) {
        linkIfacePropCMP0022OLD = "LINK_INTERFACE_LIBRARIES";
        explicitLibrariesCMP0022OLD =
          this->GetProperty(linkIfacePropCMP0022OLD);
      }
    }

    if (explicitLibrariesCMP0022OLD &&
        this->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
        !this->PolicyWarnedCMP0022) {
      // Compare the explicitly set old link interface properties to the
      // preferred new link interface property one and warn if different.
      cmValue newExplicitLibraries =
        this->GetProperty("INTERFACE_LINK_LIBRARIES");
      if (newExplicitLibraries &&
          (*newExplicitLibraries != *explicitLibrariesCMP0022OLD)) {
        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
          "Target \"" << this->GetName() << "\" has an "
          "INTERFACE_LINK_LIBRARIES property which differs from its " <<
          linkIfacePropCMP0022OLD << " properties."
          "\n"
          "INTERFACE_LINK_LIBRARIES:\n"
          "  " << *newExplicitLibraries << "\n" <<
          linkIfacePropCMP0022OLD << ":\n"
          "  " << *explicitLibrariesCMP0022OLD << "\n";
        /* clang-format on */
        this->LocalGenerator->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
        this->PolicyWarnedCMP0022 = true;
      }
    }

    haveExplicitLibraries = static_cast<bool>(explicitLibrariesCMP0022OLD);
  }

  // There is no implicit link interface for executables or modules
  // so if none was explicitly set then there is no link interface.
  if (!haveExplicitLibraries &&
      (this->GetType() == cmStateEnums::EXECUTABLE ||
       (this->GetType() == cmStateEnums::MODULE_LIBRARY))) {
    return;
  }
  iface.Exists = true;

  // If CMP0022 is NEW then the plain tll signature sets the
  // INTERFACE_LINK_LIBRARIES property.  Even if the project
  // clears it, the link interface is still explicit.
  iface.Explicit = cmp0022NEW || explicitLibrariesCMP0022OLD;

  if (cmp0022NEW) {
    // The interface libraries are specified by INTERFACE_LINK_LIBRARIES.
    // Use its special representation directly to get backtraces.
    this->ExpandLinkItems(
      kINTERFACE_LINK_LIBRARIES, this->Target->GetLinkInterfaceEntries(),
      config, headTarget, interfaceFor, LinkInterfaceField::Libraries, iface);
    this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES_DIRECT,
                          this->Target->GetLinkInterfaceDirectEntries(),
                          config, headTarget, interfaceFor,
                          LinkInterfaceField::HeadInclude, iface);
    this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
                          this->Target->GetLinkInterfaceDirectExcludeEntries(),
                          config, headTarget, interfaceFor,
                          LinkInterfaceField::HeadExclude, iface);
  } else if (explicitLibrariesCMP0022OLD) {
    // The interface libraries have been explicitly set in pre-CMP0022 style.
    std::vector<BT<std::string>> entries;
    entries.emplace_back(*explicitLibrariesCMP0022OLD);
    this->ExpandLinkItems(linkIfacePropCMP0022OLD, cmMakeRange(entries),
                          config, headTarget, interfaceFor,
                          LinkInterfaceField::Libraries, iface);
  }

  // If the link interface is explicit, do not fall back to the link impl.
  if (iface.Explicit) {
    return;
  }

  // The link implementation is the default link interface.
  if (cmLinkImplementationLibraries const* impl =
        this->GetLinkImplementationLibrariesInternal(config, headTarget,
                                                     interfaceFor)) {
    iface.Libraries.insert(iface.Libraries.end(), impl->Libraries.begin(),
                           impl->Libraries.end());
    if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
        !this->PolicyWarnedCMP0022 && interfaceFor == LinkInterfaceFor::Link) {
      // Compare the link implementation fallback link interface to the
      // preferred new link interface property and warn if different.
      cmLinkInterface ifaceNew;
      this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES,
                            this->Target->GetLinkInterfaceEntries(), config,
                            headTarget, interfaceFor,
                            LinkInterfaceField::Libraries, ifaceNew);
      if (ifaceNew.Libraries != iface.Libraries) {
        std::string oldLibraries = cmJoin(impl->Libraries, ";");
        std::string newLibraries = cmJoin(ifaceNew.Libraries, ";");
        if (oldLibraries.empty()) {
          oldLibraries = "(empty)";
        }
        if (newLibraries.empty()) {
          newLibraries = "(empty)";
        }

        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
          "Target \"" << this->GetName() << "\" has an "
          "INTERFACE_LINK_LIBRARIES property.  "
          "This should be preferred as the source of the link interface "
          "for this library but because CMP0022 is not set CMake is "
          "ignoring the property and using the link implementation "
          "as the link interface instead."
          "\n"
          "INTERFACE_LINK_LIBRARIES:\n"
          "  " << newLibraries << "\n"
          "Link implementation:\n"
          "  " << oldLibraries << "\n";
        /* clang-format on */
        this->LocalGenerator->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
        this->PolicyWarnedCMP0022 = true;
      }
    }
  }
}